

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O0

double __thiscall DynamicHistogram<double>::total(DynamicHistogram<double> *this)

{
  uint uVar1;
  runtime_error *this_00;
  iterator __first;
  iterator __last;
  double dVar2;
  double sum;
  DynamicHistogram<double> *this_local;
  
  uVar1 = (*this->_vptr_DynamicHistogram[2])();
  if ((uVar1 & 1) == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"DynamicHistogram::total - Histogram could not be initialized.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __first = std::vector<double,_std::allocator<double>_>::begin(&this->_frequencies);
  __last = std::vector<double,_std::allocator<double>_>::end(&this->_frequencies);
  dVar2 = std::
          accumulate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                    ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     __first._M_current,
                     (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     __last._M_current,0.0);
  return dVar2;
}

Assistant:

double
    total()
    {
        if (!this->merge()) throw std::runtime_error("DynamicHistogram::total - Histogram could not be initialized.");
        double sum = std::accumulate(this->_frequencies.begin(), this->_frequencies.end(), 0.0);
        return sum;
    }